

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animations.cpp
# Opt level: O0

void __thiscall FTextureManager::ParseAnimatedDoor(FTextureManager *this,FScanner *sc)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  FTexture *pFVar4;
  FTextureID *__dest;
  FTextureID *__src;
  ulong uVar5;
  FTextureID *local_d0;
  FTextureID local_58;
  byte local_51;
  FTextureID v;
  bool error;
  TArray<FTextureID,_FTextureID> frames;
  FDoorAnimation anim;
  BITFIELD texflags;
  FScanner *sc_local;
  FTextureManager *this_local;
  
  anim._28_4_ = 3;
  FDoorAnimation::FDoorAnimation((FDoorAnimation *)&frames.Most);
  TArray<FTextureID,_FTextureID>::TArray((TArray<FTextureID,_FTextureID> *)&v);
  local_51 = 0;
  FTextureID::FTextureID(&local_58);
  FScanner::MustGetString(sc);
  frames.Most = (uint)CheckForTexture(this,sc->String,1,3);
  bVar1 = FTextureID::Exists((FTextureID *)&frames.Most);
  if (bVar1) {
    pFVar4 = Texture(this,(FTextureID)frames.Most);
    *(ushort *)&pFVar4->field_0x31 = *(ushort *)&pFVar4->field_0x31 & 0xfffe | 1;
  }
  else {
    local_51 = 1;
  }
LAB_0082eae2:
  do {
    bVar1 = FScanner::GetString(sc);
    if (!bVar1) {
LAB_0082ed43:
      if ((local_51 & 1) == 0) {
        uVar3 = TArray<FTextureID,_FTextureID>::Size((TArray<FTextureID,_FTextureID> *)&v);
        uVar5 = (ulong)uVar3;
        __dest = (FTextureID *)operator_new__(uVar5 << 2);
        if (uVar5 != 0) {
          local_d0 = __dest;
          do {
            FTextureID::FTextureID(local_d0);
            local_d0 = local_d0 + 1;
          } while (local_d0 != __dest + uVar5);
        }
        anim._0_8_ = __dest;
        __src = TArray<FTextureID,_FTextureID>::operator[]((TArray<FTextureID,_FTextureID> *)&v,0);
        uVar3 = TArray<FTextureID,_FTextureID>::Size((TArray<FTextureID,_FTextureID> *)&v);
        memcpy(__dest,__src,(ulong)uVar3 << 2);
        anim.TextureFrames._0_4_ =
             TArray<FTextureID,_FTextureID>::Size((TArray<FTextureID,_FTextureID> *)&v);
        TArray<FDoorAnimation,_FDoorAnimation>::Push
                  (&this->mAnimatedDoors,(FDoorAnimation *)&frames.Most);
      }
      TArray<FTextureID,_FTextureID>::~TArray((TArray<FTextureID,_FTextureID> *)&v);
      return;
    }
    bVar1 = FScanner::Compare(sc,"opensound");
    if (!bVar1) {
      bVar1 = FScanner::Compare(sc,"closesound");
      if (bVar1) {
        FScanner::MustGetString(sc);
        FName::operator=((FName *)&anim.NumTextureFrames,sc->String);
      }
      else {
        bVar1 = FScanner::Compare(sc,"pic");
        if (bVar1) {
          FScanner::MustGetString(sc);
          bVar1 = IsNum(sc->String);
          if (bVar1) {
            iVar2 = atoi(sc->String);
            local_58 = FTextureID::operator+((FTextureID *)&frames.Most,iVar2 + -1);
          }
          else {
            local_58 = CheckForTexture(this,sc->String,1,3);
            bVar1 = FTextureID::Exists(&local_58);
            if (((!bVar1) && (bVar1 = FTextureID::Exists((FTextureID *)&frames.Most), bVar1)) &&
               ((local_51 & 1) == 0)) {
              FScanner::ScriptError(sc,"Unknown texture %s",sc->String);
            }
          }
          TArray<FTextureID,_FTextureID>::Push((TArray<FTextureID,_FTextureID> *)&v,&local_58);
        }
        else {
          bVar1 = FScanner::Compare(sc,"allowdecals");
          if (!bVar1) {
            FScanner::UnGet(sc);
            goto LAB_0082ed43;
          }
          bVar1 = FTextureID::Exists((FTextureID *)&frames.Most);
          if (bVar1) {
            pFVar4 = Texture(this,(FTextureID)frames.Most);
            *(ushort *)&pFVar4->field_0x31 = *(ushort *)&pFVar4->field_0x31 & 0xfffe;
          }
        }
      }
      goto LAB_0082eae2;
    }
    FScanner::MustGetString(sc);
    FName::operator=((FName *)((long)&anim.TextureFrames + 4),sc->String);
  } while( true );
}

Assistant:

void FTextureManager::ParseAnimatedDoor(FScanner &sc)
{
	const BITFIELD texflags = TEXMAN_Overridable | TEXMAN_TryAny;
	FDoorAnimation anim;
	TArray<FTextureID> frames;
	bool error = false;
	FTextureID v;

	sc.MustGetString();
	anim.BaseTexture = CheckForTexture (sc.String, FTexture::TEX_Wall, texflags);

	if (!anim.BaseTexture.Exists())
	{
		error = true;
	}
	else
	{
		Texture(anim.BaseTexture)->bNoDecals = true;
	}
	while (sc.GetString())
	{
		if (sc.Compare ("opensound"))
		{
			sc.MustGetString ();
			anim.OpenSound = sc.String;
		}
		else if (sc.Compare ("closesound"))
		{
			sc.MustGetString ();
			anim.CloseSound = sc.String;
		}
		else if (sc.Compare ("pic"))
		{
			sc.MustGetString ();
			if (IsNum (sc.String))
			{
				v = anim.BaseTexture + (atoi(sc.String) - 1);
			}
			else
			{
				v = CheckForTexture (sc.String, FTexture::TEX_Wall, texflags);
				if (!v.Exists() && anim.BaseTexture.Exists() && !error)
				{
					sc.ScriptError ("Unknown texture %s", sc.String);
				}
			}
			frames.Push(v);
		}
		else if (sc.Compare("allowdecals"))
		{
			if (anim.BaseTexture.Exists()) Texture(anim.BaseTexture)->bNoDecals = false;
		}
		else
		{
			sc.UnGet ();
			break;
		}
	}
	if (!error)
	{
		anim.TextureFrames = new FTextureID[frames.Size()];
		memcpy (anim.TextureFrames, &frames[0], sizeof(FTextureID) * frames.Size());
		anim.NumTextureFrames = frames.Size();
		mAnimatedDoors.Push (anim);
	}
}